

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  pointer pcVar2;
  bool bVar3;
  uint32_t uVar4;
  LogMessage *other;
  string *psVar5;
  ArenaStringPtr *pAVar6;
  FieldDescriptor *local_70;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetString",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_68._0_8_ = FieldDescriptor::TypeOnceInit;
    local_70 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_68,&local_70)
    ;
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetString",CPPTYPE_STRING);
  }
  if (((byte)field[1] & 8) != 0) {
    uVar4 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    psVar5 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4),
                        *(int *)(field + 4),*(string **)(field + 0x40));
    goto LAB_00393b5d;
  }
  lVar1 = *(long *)(field + 0x28);
  if (lVar1 == 0 || ((byte)field[1] & 0x10) == 0) {
LAB_00393b04:
    bVar3 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
    if (bVar3) {
      psVar5 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
      goto LAB_00393b5d;
    }
    pAVar6 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    psVar5 = (string *)((ulong)(pAVar6->tagged_ptr_).ptr_ & 0xfffffffffffffffe);
    if (psVar5 != (string *)0x0) goto LAB_00393b5d;
  }
  else {
    if (*(int *)(lVar1 + 4) == 1) {
      if ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0) goto LAB_00393b04;
      if ((*(byte *)(*(long *)(lVar1 + 0x20) + 1) & 2) != 0) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                   ,0x5b7);
        other = internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
        internal::LogMessage::~LogMessage(&local_68);
      }
    }
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 3)
                              * 0x33333334 + (this->schema_).oneof_case_offset_)) ==
        *(int *)(field + 4)) goto LAB_00393b04;
  }
  psVar5 = *(string **)(field + 0x40);
LAB_00393b5d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar5->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetString(const Message& message,
                                  const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return field->default_value_string();
    }
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        if (auto* value =
                GetField<ArenaStringPtr>(message, field).GetPointer()) {
          return *value;
        }
        return field->default_value_string();
      }
    }
  }
}